

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::elu(tensor *dest,tensor *src,float alpha)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  size_t sVar4;
  tensor *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  double dVar5;
  size_t i;
  float *s;
  float *d;
  ulong local_30;
  long lVar3;
  
  lVar2 = (**(code **)(*in_RDI + 0x18))();
  iVar1 = (*in_RSI->_vptr_tensor[2])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_30 = 0;
  while( true ) {
    sVar4 = tensor::size(in_RSI);
    if (sVar4 <= local_30) break;
    if (*(float *)(lVar3 + local_30 * 4) <= 0.0) {
      dVar5 = std::exp((double)(ulong)*(uint *)(lVar3 + local_30 * 4));
      *(float *)(lVar2 + local_30 * 4) = in_XMM0_Da * (SUB84(dVar5,0) - 1.0);
    }
    else {
      *(undefined4 *)(lVar2 + local_30 * 4) = *(undefined4 *)(lVar3 + local_30 * 4);
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void elu (
            tensor& dest,
            const tensor& src,
            const float alpha
        )
        {
            const auto d = dest.host();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
            {
                if (s[i] > 0)
                    d[i] = s[i];
                else
                    d[i] = alpha * (std::exp(s[i]) - 1.0f);
            }
        }